

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void close_state(lua_State *L)

{
  size_t *psVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  size_t sVar6;
  global_State *g;
  uint uVar7;
  uint *puVar8;
  undefined8 *puVar9;
  uint uVar10;
  ulong uVar11;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  lj_func_closeuv(L,(TValue *)(ulong)(L->stack).ptr32);
  (g->gc).currentwhite = 'C';
  gc_sweep(g,&(g->gc).root,0x7fffff00);
  uVar7 = g->strmask;
  uVar11 = 0;
  do {
    gc_sweep(g,g->strhash + uVar11,0x7fffff00);
    uVar10 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar10;
  } while (uVar10 <= uVar7);
  lj_mcode_free((jit_State *)(g + 1));
  uVar7 = *(uint *)((long)&g[1].hookf + 4);
  while (uVar7 != 0) {
    puVar8 = (uint *)(ulong)uVar7;
    uVar7 = *puVar8;
    (g->gc).total = (g->gc).total - 0x88;
    (*g->allocf)(g->allocd,puVar8,0x88,0);
  }
  pvVar3 = *(void **)(g[1].gcroot + 8);
  sVar6 = (ulong)g[1].gcroot[10].gcptr32 << 2;
  (g->gc).total = (g->gc).total - (int)sVar6;
  (*g->allocf)(g->allocd,pvVar3,sVar6,0);
  pvVar3 = *(void **)(g[1].gcroot + 6);
  sVar6 = (ulong)g[1].gcroot[5].gcptr32 << 3;
  (g->gc).total = (g->gc).total - (int)sVar6;
  (*g->allocf)(g->allocd,pvVar3,sVar6,0);
  uVar7 = g[1].gcroot[3].gcptr32;
  lVar4 = *(long *)g[1].gcroot;
  sVar6 = (ulong)(g[1].gcroot[2].gcptr32 - uVar7) << 3;
  (g->gc).total = (g->gc).total - (int)sVar6;
  (*g->allocf)(g->allocd,(void *)((ulong)uVar7 * 8 + lVar4),sVar6,0);
  pvVar3 = *(void **)(g[1].gcroot + 0xc);
  sVar6 = (ulong)g[1].gcroot[0xf].gcptr32 << 2;
  (g->gc).total = (g->gc).total - (int)sVar6;
  (*g->allocf)(g->allocd,pvVar3,sVar6,0);
  puVar9 = (undefined8 *)(ulong)(g->ctype_state).ptr32;
  if (puVar9 != (undefined8 *)0x0) {
    if ((void *)puVar9[0x17] != (void *)0x0) {
      munmap((void *)puVar9[0x17],0x1000);
    }
    pvVar3 = (void *)*puVar9;
    sVar6 = (ulong)*(uint *)((long)puVar9 + 0xc) << 4;
    (g->gc).total = (g->gc).total - (int)sVar6;
    (*g->allocf)(g->allocd,pvVar3,sVar6,0);
    pvVar3 = (void *)puVar9[0x18];
    uVar7 = *(uint *)(puVar9 + 0x19);
    (g->gc).total = (g->gc).total - (int)((ulong)uVar7 * 2);
    (*g->allocf)(g->allocd,pvVar3,(ulong)uVar7 * 2,0);
    (g->gc).total = (g->gc).total - 0x1d8;
    (*g->allocf)(g->allocd,puVar9,0x1d8,0);
  }
  sVar6 = (ulong)(g->strmask + 1) << 2;
  (g->gc).total = (g->gc).total - (int)sVar6;
  (*g->allocf)(g->allocd,g->strhash,sVar6,0);
  pvVar3 = g->allocd;
  uVar7 = (g->tmpbuf).sz;
  (g->gc).total = (g->gc).total - uVar7;
  (*g->allocf)(pvVar3,(g->tmpbuf).buf,(ulong)uVar7,0);
  uVar7 = (L->stack).ptr32;
  sVar6 = (ulong)L->stacksize << 3;
  (g->gc).total = (g->gc).total - (int)sVar6;
  (*g->allocf)(g->allocd,(void *)(ulong)uVar7,sVar6,0);
  if (g->allocf != lj_alloc_f) {
    (*g->allocf)(g->allocd,g[-1].gcroot + 0x16,0x1470,0);
    return;
  }
  puVar9 = (undefined8 *)((long)g->allocd + 0x348);
  piVar5 = __errno_location();
  do {
    pvVar3 = (void *)*puVar9;
    psVar1 = puVar9 + 1;
    puVar9 = (undefined8 *)puVar9[2];
    iVar2 = *piVar5;
    munmap(pvVar3,*psVar1);
    *piVar5 = iVar2;
  } while (puVar9 != (undefined8 *)0x0);
  return;
}

Assistant:

static void close_state(lua_State *L)
{
  global_State *g = G(L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_freeall(g);
  lua_assert(gcref(g->gc.root) == obj2gco(L));
  lua_assert(g->strnum == 0);
  lj_trace_freestate(g);
#if LJ_HASFFI
  lj_ctype_freestate(g);
#endif
  lj_mem_freevec(g, g->strhash, g->strmask+1, GCRef);
  lj_str_freebuf(g, &g->tmpbuf);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
  lua_assert(g->gc.total == sizeof(GG_State));
#ifndef LUAJIT_USE_SYSMALLOC
  if (g->allocf == lj_alloc_f)
    lj_alloc_destroy(g->allocd);
  else
#endif
    g->allocf(g->allocd, G2GG(g), sizeof(GG_State), 0);
}